

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O3

void av1_nn_output_prec_reduce(float *output,int num_output)

{
  ulong uVar1;
  
  if (0 < num_output) {
    uVar1 = 0;
    do {
      output[uVar1] = (float)(int)(output[uVar1] * 512.0 + 0.5) * 0.001953125;
      uVar1 = uVar1 + 1;
    } while ((uint)num_output != uVar1);
  }
  return;
}

Assistant:

void av1_nn_output_prec_reduce(float *const output, int num_output) {
  const int prec_bits = 9;
  const int prec = 1 << prec_bits;
  const float inv_prec = (float)(1.0 / prec);
  for (int i = 0; i < num_output; i++) {
    output[i] = ((int)(output[i] * prec + 0.5)) * inv_prec;
  }
}